

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# form.cpp
# Opt level: O2

number_validator<double> __thiscall goodform::sub_form::float64(sub_form *this)

{
  bool bVar1;
  undefined8 *in_RSI;
  number_validator<double> nVar2;
  double val;
  allocator<char> local_61;
  any *local_60;
  string local_58;
  error_message local_38;
  
  bVar1 = convert<double>((any *)in_RSI[1],(double *)&local_60);
  if (!bVar1) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_58,"NOT A float64",&local_61);
    error_message::error_message(&local_38,&local_58);
    std::__cxx11::string::operator=((string *)*in_RSI,(string *)&local_38);
    std::__cxx11::string::~string((string *)&local_38);
    std::__cxx11::string::~string((string *)&local_58);
  }
  this->error_ = (error_message *)*in_RSI;
  this->variant_ = local_60;
  nVar2.value_ = (double)local_60;
  nVar2.error_ = (error_message *)this;
  return nVar2;
}

Assistant:

number_validator<double> sub_form::float64()
  {
    double val;
    if (!convert(this->variant_, val))
      this->error_ = error_message("NOT A float64");
    return number_validator<double>(val, this->error_);
  }